

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O2

void readtestfile(char *data_file)

{
  int *piVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int j_1;
  uint uVar6;
  vector<double,_std::allocator<double>_> *this;
  int iVar7;
  long lVar8;
  int i;
  int j;
  _Vector_base<double,_std::allocator<double>_> _Stack_30da8;
  int iStack_30d90;
  int iStack_30d8c;
  FILE *pFStack_30d88;
  long lStack_30d80;
  char buff [200000];
  
  pFStack_30d88 = fopen(data_file,"r");
  for (iVar7 = 0; uVar6 = test_n, iVar7 < test_n; iVar7 = iVar7 + 1) {
    _Stack_30da8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Stack_30da8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_30da8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&test_x,(vector<double,_std::allocator<double>_> *)&_Stack_30da8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_30da8);
    _Stack_30da8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Stack_30da8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_30da8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&test_y,(vector<double,_std::allocator<double>_> *)&_Stack_30da8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_30da8);
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < test_n) {
    uVar4 = (long)test_n << 2;
  }
  pvVar2 = operator_new__(uVar4);
  iVar7 = 200000;
  lVar8 = 0;
  while (lVar8 < (int)uVar6) {
    iStack_30d8c = iVar7;
    fgets(buff,200000,pFStack_30d88);
    pcVar3 = strtok(buff,", \r\n");
    iStack_30d90 = atoi(pcVar3);
    *(int *)((long)pvVar2 + lVar8 * 4) = iStack_30d90;
    pcVar3 = strtok((char *)0x0,", \r\n");
    lStack_30d80 = lVar8;
    for (iVar7 = 0; iVar7 < ts_len; iVar7 = iVar7 + 1) {
      this = test_x.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8;
      _Stack_30da8._M_impl.super__Vector_impl_data._M_start = (pointer)atof(pcVar3);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this,(double *)&_Stack_30da8);
      pcVar3 = strtok((char *)0x0,", \r\n");
    }
    iVar7 = iStack_30d8c;
    if (iStack_30d90 < iStack_30d8c) {
      iVar7 = iStack_30d90;
    }
    uVar6 = test_n;
    lVar8 = lStack_30d80 + 1;
  }
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    piVar1 = (int *)((long)pvVar2 + uVar4 * 4);
    *piVar1 = *piVar1 - iVar7;
  }
  for (lVar8 = 0; lVar8 < (int)uVar6; lVar8 = lVar8 + 1) {
    for (iVar7 = 0; iVar7 < num_c; iVar7 = iVar7 + 1) {
      if (iVar7 == *(int *)((long)pvVar2 + lVar8 * 4)) {
        _Stack_30da8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
      }
      else {
        _Stack_30da8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (test_y.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,(double *)&_Stack_30da8);
    }
    uVar6 = test_n;
  }
  operator_delete__(pvVar2);
  fclose(pFStack_30d88);
  return;
}

Assistant:

void readtestfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < test_n; ++i) {
        test_x.push_back(vector<double>());
        test_y.push_back(vector<double>());
    }

    int *label = new int[test_n];
    int min_c = MAX_CHAR_PER_LINE;

    for (int i = 0; i < test_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        label[i] = atoi(tmp);
        min_c = min(min_c, label[i]);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {
            test_x[i].push_back(atof(tmp));
            tmp = strtok(NULL, ", \r\n");
        }
    }

    for (int i = 0; i < test_n; ++i) {
        label[i] -= min_c;
    }

    /**
     * label(xi) = a => y = {0 .... 1 .... 0}
     *                              ^
     *                              a position
     */
    for (int i = 0; i < test_n; ++i) {
        for (int j = 0; j < num_c; ++j) {
            if (j == label[i]) {
                test_y[i].push_back(1.0);
            } else {
                test_y[i].push_back(0.0);
            }
        }
    }

    delete[] label;

    fclose(f);
}